

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void reindexDatabases(Parse *pParse,char *zColl)

{
  sqlite3 *psVar1;
  int iVar2;
  Db *pDVar3;
  HashElem *pHVar4;
  
  psVar1 = pParse->db;
  if (0 < psVar1->nDb) {
    pDVar3 = psVar1->aDb;
    iVar2 = 0;
    do {
      for (pHVar4 = (pDVar3->pSchema->tblHash).first; pHVar4 != (HashElem *)0x0;
          pHVar4 = pHVar4->next) {
        reindexTable(pParse,(Table *)pHVar4->data,zColl);
      }
      iVar2 = iVar2 + 1;
      pDVar3 = pDVar3 + 1;
    } while (iVar2 < psVar1->nDb);
  }
  return;
}

Assistant:

static void reindexDatabases(Parse *pParse, char const *zColl){
  Db *pDb;                    /* A single database */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  HashElem *k;                /* For looping over tables in pDb */
  Table *pTab;                /* A table in the database */

  assert( sqlite3BtreeHoldsAllMutexes(db) );  /* Needed for schema access */
  for(iDb=0, pDb=db->aDb; iDb<db->nDb; iDb++, pDb++){
    assert( pDb!=0 );
    for(k=sqliteHashFirst(&pDb->pSchema->tblHash);  k; k=sqliteHashNext(k)){
      pTab = (Table*)sqliteHashData(k);
      reindexTable(pParse, pTab, zColl);
    }
  }
}